

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Mocap::ArchiveIN(ChFunction_Mocap *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Mocap>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->samp_freq;
  local_38 = "samp_freq";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = (double *)&this->samples;
  local_38 = "samples";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = &this->timetot;
  local_38 = "timetot";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Mocap::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Mocap>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    ////marchive >> CHNVP(array_y);
    ////marchive >> CHNVP(array_y_dt);
    ////marchive >> CHNVP(array_y_dtdt);
    marchive >> CHNVP(samp_freq);
    marchive >> CHNVP(samples);
    marchive >> CHNVP(timetot);
}